

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* exact_lookup_abi_cxx11_
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string_view symbol)

{
  vector<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this;
  bool bVar1;
  size_type sVar2;
  reference this_00;
  size_type local_b0;
  char *local_a8;
  basic_string_view<char,_std::char_traits<char>_> *local_a0;
  basic_string_view<char,_std::char_traits<char>_> *lib;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range1;
  vector<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_70;
  vector<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_58;
  vector<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>
  *libs;
  pointer local_48;
  char *local_40;
  undefined1 local_38 [8];
  vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_> symbols;
  string_view symbol_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *retval;
  
  local_40 = symbol._M_str;
  local_48 = (pointer)symbol._M_len;
  symbols.super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_48;
  lookup((vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_> *)local_38,symbol,exact);
  bVar1 = std::vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>::empty
                    ((vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_> *)local_38);
  if (bVar1) {
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__);
    libs._4_4_ = 1;
  }
  else {
    sVar2 = std::vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>::size
                      ((vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_> *)local_38);
    if (sVar2 != 1) {
      __assert_fail("symbols.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Toeger[P]LibFinder/lookup.cpp"
                    ,0xa3,"std::vector<std::string> exact_lookup(string_view)");
    }
    libs._3_1_ = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__);
    this_00 = std::vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>::front
                        ((vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_> *)local_38);
    Symbol_lib_entry::get_libs_view(&local_70,this_00);
    local_58 = &local_70;
    sVar2 = std::
            vector<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::size(local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(__return_storage_ptr__,sVar2);
    this = local_58;
    __end1 = std::
             vector<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::begin(local_58);
    lib = (basic_string_view<char,_std::char_traits<char>_> *)
          std::
          vector<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::end(this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                       *)&lib), bVar1) {
      local_a0 = __gnu_cxx::
                 __normal_iterator<const_std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 ::operator*(&__end1);
      local_a8 = std::experimental::fundamentals_v1::
                 basic_string_view<char,_std::char_traits<char>_>::data(local_a0);
      local_b0 = std::experimental::fundamentals_v1::
                 basic_string_view<char,_std::char_traits<char>_>::size(local_a0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*,unsigned_long>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_a8,&local_b0);
      __gnu_cxx::
      __normal_iterator<const_std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::operator++(&__end1);
    }
    libs._3_1_ = 1;
    libs._4_4_ = 1;
    std::
    vector<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~vector(&local_70);
    if ((libs._3_1_ & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(__return_storage_ptr__);
    }
  }
  std::vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>::~vector
            ((vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> exact_lookup(string_view symbol) {
	auto symbols = lookup(symbol, Search_type::exact);
	if (symbols.empty()) {
		return {};
	};
	assert(symbols.size() == 1);
	std::vector<std::string> retval;
	const auto &libs = symbols.front().get_libs_view();
	retval.reserve(libs.size());
	//std::copy(std::begin(libs), std::end(libs), std::back_inserter(retval));
	for (auto &lib : libs) {
		retval.emplace_back(lib.data(), lib.size());
	}
	return retval;
}